

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_etc.c
# Opt level: O2

void ppMinPoly(word *b,word *a,size_t l,void *stack)

{
  word *a_00;
  word *a_01;
  ulong *puVar1;
  word *a_02;
  size_t sVar2;
  size_t n;
  word wVar3;
  ulong uVar4;
  size_t n_00;
  long lVar5;
  ulong n_01;
  long lVar6;
  ulong n_02;
  long lVar7;
  bool bVar8;
  
  uVar4 = l + 0x3f >> 6;
  n_01 = l + 0x40 >> 6;
  sVar2 = uVar4 * 2;
  a_00 = (word *)((long)stack + uVar4 * 0x10);
  a_02 = a_00 + uVar4 * 5 + 3;
  a_01 = a_02 + n_01;
  wwCopy((word *)stack,a,sVar2);
  wwTrimHi((word *)stack,sVar2,l * 2);
  sVar2 = wwWordSize((word *)stack,sVar2);
  n_02 = l * 2 + 0x40 >> 6;
  wwSetZero(a_00,n_02);
  wwSetBit(a_00,l * 2,1);
  wwSetW(a_02,n_01,1);
  wwSetZero(a_01,n_01);
  while( true ) {
    n_00 = sVar2;
    sVar2 = ppDeg((word *)stack,n_00);
    if (sVar2 + 1 <= l) break;
    ppDiv(a_00 + uVar4 * 2 + 1,a_00 + uVar4 * 3 + 3,a_00,n_02,(word *)stack,n_00,
          a_01 + n_01 + uVar4 + 2);
    sVar2 = wwWordSize(a_00 + uVar4 * 2 + 1,(n_02 - n_00) + 1);
    n = wwWordSize(a_02,n_01);
    lVar6 = uVar4 * 4 + sVar2;
    lVar5 = n + uVar4 * 7 + n_01 + 2 + sVar2;
    lVar7 = uVar4 * 0x38 + n_01 * 8 + 0x10 + sVar2 * 8;
    while (bVar8 = sVar2 != 0, sVar2 = sVar2 - 1, bVar8) {
      wVar3 = ppAddMulW((word *)((long)stack + lVar7),a_02,n,*(word *)((long)stack + lVar6 * 8),
                        a_01 + n_01 + uVar4 + 2);
      puVar1 = (ulong *)((long)stack + lVar5 * 8);
      *puVar1 = *puVar1 ^ wVar3;
      lVar6 = lVar6 + -1;
      lVar5 = lVar5 + -1;
      lVar7 = lVar7 + -8;
    }
    wwSwap(a_02,a_01,n_01);
    wwCopy(a_00,(word *)stack,n_00);
    wwCopy((word *)stack,a_00 + uVar4 * 3 + 3,n_00);
    sVar2 = wwWordSize((word *)stack,n_00);
    n_02 = n_00;
  }
  wwCopy(b,a_02,n_01);
  return;
}

Assistant:

void ppMinPoly(word b[], const word a[], size_t l, void* stack)
{
	const size_t n = W_OF_B(l);
	const size_t m = W_OF_B(l + 1);
	size_t na, nb;
	// переменные в stack
	word* aa = (word*)stack;
	word* bb = aa + 2 * n;
	word* q = bb + 2 * n + 1;
	word* r = q + n + 2;
	word* da = r + 2 * n;
	word* db = da + m;
	stack = db + m + n + 2;
	// pre
	ASSERT(wwIsValid(b, m) && wwIsValid(a, 2 * n));
	// aa <- a
	wwCopy(aa, a, 2 * n);
	wwTrimHi(aa, 2 * n, 2 * l);
	na = wwWordSize(aa, 2 * n);
	// bb <- x^{2l}
	nb = W_OF_B(2 * l + 1);
	wwSetZero(bb, nb);
	wwSetBit(bb, 2 * l, 1);
	// da <- 1
	wwSetW(da, m, 1);
	// db <- 0
	wwSetZero(db, m);
	// пока deg(aa) >= len
	while (ppDeg(aa, na) + 1 > l)
	{
		size_t nq, nda;
		// (q, r) <- (bb div aa, bb mod aa)
		ppDiv(q, r, bb, nb, aa, na, stack);
		// db <- db + q * da
		nq = wwWordSize(q, nb - na + 1);
		nda = wwWordSize(da, m);
		while (nq--)
			db[nq + nda] ^= ppAddMulW(db + nq, da, nda, q[nq], stack);
		ASSERT(nq + nda <= m || wwIsZero(db, nq + nda - m));
		// da <-> db
		wwSwap(da, db, m);
		// bb <- aa
		wwCopy(bb, aa, na);
		nb = na;
		// aa <- r
		wwCopy(aa, r, na);
		na = wwWordSize(aa, na);
	}
	// b <- da
	wwCopy(b, da, m);
}